

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_data_source_seek_seconds
                    (ma_data_source *pDataSource,float secondCount,float *pSecondsSeeked)

{
  ma_result mVar1;
  ulong uVar2;
  uint uVar3;
  ma_data_source_base *pDataSourceBase;
  float fVar4;
  ma_uint64 framesSeeked;
  ma_uint32 sampleRate;
  ma_uint32 channels;
  ma_format format;
  ma_uint64 local_38;
  uint local_2c;
  undefined1 local_28 [4];
  undefined1 local_24 [4];
  
  local_38 = 0;
  if (pDataSource == (ma_data_source *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    if (*(code **)(*pDataSource + 0x10) == (code *)0x0) {
      mVar1 = MA_NOT_IMPLEMENTED;
      fVar4 = 0.0;
    }
    else {
      mVar1 = (**(code **)(*pDataSource + 0x10))(pDataSource,local_24,local_28,&local_2c,0,0);
      uVar3 = 0;
      if (mVar1 == MA_SUCCESS) {
        uVar3 = local_2c;
      }
      fVar4 = (float)uVar3;
    }
    if (mVar1 == MA_SUCCESS) {
      uVar2 = (ulong)(secondCount * fVar4);
      mVar1 = ma_data_source_read_pcm_frames
                        (pDataSource,(void *)0x0,
                         (long)(secondCount * fVar4 - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2,
                         &local_38);
      *pSecondsSeeked = (float)(long)local_38 / fVar4;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_data_source_seek_seconds(ma_data_source* pDataSource, float secondCount, float* pSecondsSeeked)
{
    ma_uint64 frameCount;
    ma_uint64 framesSeeked = 0;
    ma_uint32 sampleRate;
    ma_result result;

    if (pDataSource == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_data_source_get_data_format(pDataSource, NULL, NULL, &sampleRate, NULL, 0);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* We need PCM frames instead of seconds */
    frameCount = (ma_uint64)(secondCount * sampleRate);

    result = ma_data_source_seek_pcm_frames(pDataSource, frameCount, &framesSeeked);

    /* VC6 doesn't support division between unsigned 64-bit integer and floating point number. Signed integer needed. This shouldn't affect anything in practice */
    *pSecondsSeeked = (ma_int64)framesSeeked / (float)sampleRate;
    return result;
}